

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O1

void __thiscall BmsBuffer::MagnifyBy(BmsBuffer *this,double multiplier)

{
  map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_> *this_00;
  _Rb_tree_node_base *p_Var1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>,_std::_Rb_tree_iterator<std::pair<const_int,_BmsWord>_>_>
  pVar4;
  int local_40;
  _Rb_tree_color local_3c;
  double local_38;
  
  if ((int)(this->array_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_38 = multiplier;
    p_Var1 = (_Rb_tree_node_base *)
             std::_Rb_tree_decrement(&(this->array_)._M_t._M_impl.super__Rb_tree_header._M_header);
    this_00 = &this->array_;
    while( true ) {
      pmVar2 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               operator[](this_00,(key_type *)(p_Var1 + 1));
      local_40 = (int)((double)(int)p_Var1[1]._M_color * local_38);
      pmVar3 = std::
               map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::
               operator[](this_00,&local_40);
      pmVar3->value_ = pmVar2->value_;
      local_3c = p_Var1[1]._M_color;
      pVar4 = std::
              _Rb_tree<int,_std::pair<const_int,_BmsWord>,_std::_Select1st<std::pair<const_int,_BmsWord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
              ::equal_range(&this_00->_M_t,(key_type *)&local_3c);
      std::
      _Rb_tree<int,_std::pair<const_int,_BmsWord>,_std::_Select1st<std::pair<const_int,_BmsWord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
      if (p_Var1 == (this->array_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) break;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var1);
    }
  }
  return;
}

Assistant:

void
BmsBuffer::MagnifyBy(double multiplier)
{
	if (GetObjectCount() == 0) return;
	for (auto it = --End();; --it) {
		array_[it->first * multiplier] = array_[it->first];
		DeleteAt(it->first);
		if (it == Begin()) break;
	}
}